

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall glcts::AdvancedUsageSwitchPrograms::Setup(AdvancedUsageSwitchPrograms *this)

{
  this->prog_[5] = 0;
  this->prog_[6] = 0;
  *(undefined8 *)(this->prog_ + 7) = 0;
  this->prog_[1] = 0;
  this->prog_[2] = 0;
  this->prog_[3] = 0;
  this->prog_[4] = 0;
  this->xfb_buffer_ = 0;
  this->vao_ = 0;
  this->vbo_ = 0;
  this->prog_[0] = 0;
  this->counter_buffer_[4] = 0;
  this->counter_buffer_[5] = 0;
  this->counter_buffer_[6] = 0;
  this->counter_buffer_[7] = 0;
  this->counter_buffer_[0] = 0;
  this->counter_buffer_[1] = 0;
  this->counter_buffer_[2] = 0;
  this->counter_buffer_[3] = 0;
  this->rt_ = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		memset(counter_buffer_, 0, sizeof(counter_buffer_));
		xfb_buffer_ = 0;
		vao_ = vbo_ = 0;
		memset(prog_, 0, sizeof(prog_));
		fbo_ = rt_ = 0;
		return NO_ERROR;
	}